

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::RegisterTests
          (ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>
           *this)

{
  pointer psVar1;
  pointer pIVar2;
  ParamNameGeneratorFunc *pPVar3;
  char *pcVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
  _Var5;
  _Alloc_hider name;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer __lhs;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
  _Var9;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
  _Var10;
  undefined4 extraout_var_01;
  ostream *poVar11;
  size_type sVar12;
  char *pcVar13;
  undefined4 extraout_var_02;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  size_type index;
  ulong uVar14;
  size_type sVar15;
  pointer psVar16;
  bool bVar17;
  string param_name;
  ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> generator;
  ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> local_2c8;
  ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> local_2c0;
  string test_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  char *local_248 [4];
  string local_228;
  CodeLocation local_208;
  CodeLocation local_1e0;
  undefined1 local_1b8 [392];
  Fixed32Case *value;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  bVar17 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name.field_2._M_local_buf[0] = '\0';
  psVar16 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar16 == psVar1) {
      if (!bVar17) {
        iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_208,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar8),&local_208,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_208);
      }
      std::__cxx11::string::~string((string *)&test_name);
      std::__cxx11::string::~string((string *)&test_suite_name);
      return;
    }
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar2; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar3 = __lhs->name_func;
      pcVar4 = __lhs->file;
      iVar8 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)local_1b8);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var9._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl._0_4_ =
           (*(generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      _Var9._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl._4_4_ = extraout_var;
      local_2c0.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl =
           (unique_ptr<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            )(unique_ptr<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
              )_Var9._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
               ._M_head_impl;
      _Var10._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl._0_4_ =
           (*(generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      _Var10._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl._4_4_ = extraout_var_00;
      sVar15 = 0;
      local_2c8.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
      ._M_head_impl =
           (unique_ptr<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            )(unique_ptr<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
              )_Var10._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
               ._M_head_impl;
      while( true ) {
        bVar6 = ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::operator!=
                          (&local_2c0,&local_2c8);
        if (!bVar6) break;
        iVar7 = (*(*(_func_int ***)
                    _Var9._M_t.
                    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
                    ._M_head_impl)[5])();
        value = (Fixed32Case *)CONCAT44(extraout_var_01,iVar7);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        local_1b8._0_8_ = *value;
        local_1b8._8_8_ = sVar15;
        (*pPVar3)(&param_name,
                  (TestParamInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *)
                  local_1b8);
        if (param_name._M_string_length == 0) {
          bVar17 = false;
        }
        else {
          for (uVar14 = 0; bVar17 = param_name._M_string_length <= uVar14, !bVar17;
              uVar14 = uVar14 + 1) {
            bVar6 = IsAlNum(param_name._M_dataplus._M_p[uVar14]);
            if ((!bVar6) && (param_name._M_dataplus._M_p[uVar14] != '_')) break;
          }
        }
        bVar17 = IsTrue(bVar17);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar11 = std::operator<<(poVar11,"Parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,
                                    "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
          poVar11 = std::operator<<(poVar11,anon_var_dwarf_651463 + 5);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar17 = IsTrue(sVar12 == 0);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar11 = std::operator<<(poVar11,"Duplicate parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\', in ");
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        if ((((psVar16->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar13 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar13);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_228,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        UniversalPrinter<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::Print
                  (value,(ostream *)(local_1b8 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        pcVar13 = local_248[0];
        CodeLocation::CodeLocation
                  (&local_1e0,
                   &((psVar16->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])();
        bVar17 = IsTrue(true);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar8);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        bVar17 = IsTrue(true);
        if (!bVar17) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                   );
          poVar11 = std::operator<<(poVar11,pcVar4);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar8);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        _Var5.
        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
        ._M_head_impl =
             (((psVar16->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->test_meta_factory)._M_t.
             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
             .
             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
        ;
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)_Var5.
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
                                        ._M_head_impl + 0x10))
                            (_Var5.
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
                             ._M_head_impl,*value);
        MakeAndRegisterTestInfo
                  (&local_228,name._M_p,(char *)0x0,pcVar13,&local_1e0,
                   (TypeId)CONCAT44(extraout_var_02,iVar7),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,factory);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)&local_228);
        sVar15 = sVar15 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar17 = true;
        (*(*(_func_int ***)
            _Var9._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
            ._M_head_impl)[3])();
      }
      if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
           )_Var10._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
           )0x0) {
        (*(*(_func_int ***)
            _Var10._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
            ._M_head_impl)[1])();
      }
      if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
           )_Var9._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
           )0x0) {
        (*(*(_func_int ***)
            _Var9._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_*,_false>
            ._M_head_impl)[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    psVar16 = psVar16 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }